

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoop::updateChannel(EventLoop *this,Channel *channel)

{
  Poller *pPVar1;
  bool bVar2;
  
  if (channel->m_loop == this) {
    bVar2 = isInLoopThread(this);
    if (!bVar2) {
      abortNotInLoopThread(this);
    }
    pPVar1 = (this->m_poller)._M_t.
             super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>.
             _M_t.
             super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>.
             super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl;
    (*pPVar1->_vptr_Poller[3])(pPVar1,channel);
    return;
  }
  __assert_fail("channel->ownerLoop() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                ,0xc9,"void sznet::net::EventLoop::updateChannel(Channel *)");
}

Assistant:

void EventLoop::updateChannel(Channel* channel)
{
	assert(channel->ownerLoop() == this);
	assertInLoopThread();
	m_poller->updateChannel(channel);
}